

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CGL::OSDText::del_line(OSDText *this,int line_id)

{
  pointer pOVar1;
  pointer pcVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  pointer pOVar6;
  long lVar7;
  
  pOVar6 = (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pOVar6 == (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (pOVar6->id == line_id) break;
    pOVar6 = pOVar6 + 1;
  }
  pOVar1 = (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pOVar6 + 1 != pOVar1) && (uVar5 = (long)pOVar1 - (long)(pOVar6 + 1), 0 < (long)uVar5)) {
    lVar7 = uVar5 / 0x48 + 1;
    do {
      pOVar6->y = pOVar6[1].y;
      fVar3 = pOVar6[1].x;
      pOVar6->id = pOVar6[1].id;
      pOVar6->x = fVar3;
      std::__cxx11::string::operator=((string *)&pOVar6->text,(string *)&pOVar6[1].text);
      fVar3 = pOVar6[1].color.r;
      fVar4 = pOVar6[1].color.g;
      pOVar6->size = pOVar6[1].size;
      (pOVar6->color).r = fVar3;
      (pOVar6->color).g = fVar4;
      (pOVar6->color).b = pOVar6[1].color.b;
      lVar7 = lVar7 + -1;
      pOVar6 = pOVar6 + 1;
    } while (1 < lVar7);
  }
  pOVar6 = (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar6 + -1;
  pcVar2 = pOVar6[-1].text._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pOVar6[-1].text.field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

void OSDText::del_line(int line_id) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      lines.erase(it);
      break;
    }
    ++it;
  }
}